

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gravity_parser.c
# Opt level: O2

gnode_t * gravity_parser_run(gravity_parser_t *parser,gravity_delegate_t *delegate)

{
  gravity_lexer_t *pgVar1;
  gravity_delegate_t *pgVar2;
  size_t sVar3;
  double dVar4;
  gtoken_t gVar5;
  char *pcVar6;
  size_t len;
  gravity_lexer_t *pgVar7;
  gravity_lexer_t **ppgVar8;
  char **ppcVar9;
  gnode_r *pgVar10;
  gnode_t *pgVar11;
  gnode_t **ppgVar12;
  nanotime_t tstart;
  nanotime_t tend;
  lexer_r *plVar13;
  size_t sVar14;
  ulong uVar15;
  size_t sVar16;
  long lVar17;
  
  parser->delegate = delegate;
  gravity_lexer_setdelegate(parser->lexer->p[parser->lexer->n - 1],delegate);
  sVar3 = 8;
  if ((((delegate != (gravity_delegate_t *)0x0) &&
       (delegate->precode_callback != (gravity_precode_callback)0x0)) &&
      (pcVar6 = (*delegate->precode_callback)(delegate->xdata), pcVar6 != (char *)0x0)) &&
     ((len = strlen(pcVar6), len != 0 &&
      (pgVar7 = gravity_lexer_create(pcVar6,len,0,true), pgVar7 != (gravity_lexer_t *)0x0)))) {
    plVar13 = parser->lexer;
    sVar16 = plVar13->n;
    ppgVar8 = plVar13->p;
    sVar14 = sVar16 - 1;
    plVar13->n = sVar14;
    pgVar1 = ppgVar8[sVar16 - 1];
    if (sVar14 == plVar13->m) {
      sVar16 = sVar14 * 2;
      if (sVar14 == 0) {
        sVar16 = sVar3;
      }
      plVar13->m = sVar16;
      ppgVar8 = (gravity_lexer_t **)realloc(ppgVar8,sVar16 << 3);
      plVar13 = parser->lexer;
      plVar13->p = ppgVar8;
      sVar14 = plVar13->n;
    }
    plVar13->n = sVar14 + 1;
    ppgVar8[sVar14] = pgVar7;
    plVar13 = parser->lexer;
    sVar14 = plVar13->n;
    if (sVar14 == plVar13->m) {
      sVar16 = sVar14 * 2;
      if (sVar14 == 0) {
        sVar16 = sVar3;
      }
      plVar13->m = sVar16;
      ppgVar8 = (gravity_lexer_t **)realloc(plVar13->p,sVar16 << 3);
      plVar13 = parser->lexer;
      plVar13->p = ppgVar8;
      sVar14 = plVar13->n;
    }
    else {
      ppgVar8 = plVar13->p;
    }
    plVar13->n = sVar14 + 1;
    ppgVar8[sVar14] = pgVar1;
  }
  ppcVar9 = gravity_core_identifiers();
  uVar15 = 0;
  pgVar10 = gnode_array_create();
  while( true ) {
    if (ppcVar9[uVar15] == (char *)0x0) break;
    pcVar6 = string_dup(ppcVar9[uVar15]);
    sVar14 = parser->declarations->n;
    if (sVar14 == 0) {
      pgVar11 = (gnode_t *)0x0;
    }
    else {
      pgVar11 = parser->declarations->p[sVar14 - 1];
    }
    pgVar11 = gnode_variable_create
                        ((gtoken_s)ZEXT1640(ZEXT816(0)),pcVar6,(char *)0x0,(gnode_t *)0x0,pgVar11,
                         (gnode_variable_decl_t *)0x0);
    sVar14 = pgVar10->n;
    ppgVar12 = pgVar10->p;
    if (sVar14 == pgVar10->m) {
      sVar16 = sVar14 * 2;
      if (sVar14 == 0) {
        sVar16 = sVar3;
      }
      pgVar10->m = sVar16;
      ppgVar12 = (gnode_t **)realloc(ppgVar12,sVar16 << 3);
      pgVar10->p = ppgVar12;
      sVar14 = pgVar10->n;
    }
    pgVar10->n = sVar14 + 1;
    ppgVar12[sVar14] = pgVar11;
    uVar15 = (ulong)((int)uVar15 + 1);
  }
  sVar14 = parser->declarations->n;
  if (sVar14 == 0) {
    pgVar11 = (gnode_t *)0x0;
  }
  else {
    pgVar11 = parser->declarations->p[sVar14 - 1];
  }
  pgVar11 = gnode_variable_decl_create
                      ((gtoken_s)ZEXT1640(ZEXT816(0)),TOK_KEY_VAR,TOK_EOF,TOK_KEY_EXTERN,pgVar10,
                       pgVar11);
  pgVar10 = parser->statements;
  sVar14 = pgVar10->n;
  if (sVar14 == pgVar10->m) {
    sVar16 = sVar14 * 2;
    if (sVar14 == 0) {
      sVar16 = sVar3;
    }
    pgVar10->m = sVar16;
    ppgVar12 = (gnode_t **)realloc(pgVar10->p,sVar16 << 3);
    pgVar10 = parser->statements;
    pgVar10->p = ppgVar12;
    sVar14 = pgVar10->n;
  }
  else {
    ppgVar12 = pgVar10->p;
  }
  pgVar10->n = sVar14 + 1;
  ppgVar12[sVar14] = pgVar11;
  pgVar10 = gnode_array_create();
  for (lVar17 = 0; lVar17 != 0x20; lVar17 = lVar17 + 8) {
    pcVar6 = string_dup(*(char **)((long)&gravity_optional_identifiers_list + lVar17));
    sVar14 = parser->declarations->n;
    if (sVar14 == 0) {
      pgVar11 = (gnode_t *)0x0;
    }
    else {
      pgVar11 = parser->declarations->p[sVar14 - 1];
    }
    pgVar11 = gnode_variable_create
                        ((gtoken_s)ZEXT1640(ZEXT816(0)),pcVar6,(char *)0x0,(gnode_t *)0x0,pgVar11,
                         (gnode_variable_decl_t *)0x0);
    sVar14 = pgVar10->n;
    ppgVar12 = pgVar10->p;
    if (sVar14 == pgVar10->m) {
      sVar16 = sVar14 * 2;
      if (sVar14 == 0) {
        sVar16 = sVar3;
      }
      pgVar10->m = sVar16;
      ppgVar12 = (gnode_t **)realloc(ppgVar12,sVar16 << 3);
      pgVar10->p = ppgVar12;
      sVar14 = pgVar10->n;
    }
    pgVar10->n = sVar14 + 1;
    ppgVar12[sVar14] = pgVar11;
  }
  pgVar2 = parser->delegate;
  if ((pgVar2 != (gravity_delegate_t *)0x0) &&
     (pgVar2->optional_classes != (gravity_optclass_callback)0x0)) {
    ppcVar9 = (*pgVar2->optional_classes)(pgVar2->xdata);
    uVar15 = 0;
    while( true ) {
      if (ppcVar9[uVar15] == (char *)0x0) break;
      pcVar6 = string_dup(ppcVar9[uVar15]);
      sVar14 = parser->declarations->n;
      if (sVar14 == 0) {
        pgVar11 = (gnode_t *)0x0;
      }
      else {
        pgVar11 = parser->declarations->p[sVar14 - 1];
      }
      pgVar11 = gnode_variable_create
                          ((gtoken_s)ZEXT1640(ZEXT816(0)),pcVar6,(char *)0x0,(gnode_t *)0x0,pgVar11,
                           (gnode_variable_decl_t *)0x0);
      sVar14 = pgVar10->n;
      ppgVar12 = pgVar10->p;
      if (sVar14 == pgVar10->m) {
        sVar16 = sVar14 * 2;
        if (sVar14 == 0) {
          sVar16 = sVar3;
        }
        pgVar10->m = sVar16;
        ppgVar12 = (gnode_t **)realloc(ppgVar12,sVar16 << 3);
        pgVar10->p = ppgVar12;
        sVar14 = pgVar10->n;
      }
      pgVar10->n = sVar14 + 1;
      ppgVar12[sVar14] = pgVar11;
      uVar15 = (ulong)((int)uVar15 + 1);
    }
  }
  sVar14 = parser->declarations->n;
  if (sVar14 == 0) {
    pgVar11 = (gnode_t *)0x0;
  }
  else {
    pgVar11 = parser->declarations->p[sVar14 - 1];
  }
  pgVar11 = gnode_variable_decl_create
                      ((gtoken_s)ZEXT1640(ZEXT816(0)),TOK_KEY_VAR,TOK_EOF,TOK_KEY_EXTERN,pgVar10,
                       pgVar11);
  pgVar10 = parser->statements;
  sVar14 = pgVar10->n;
  if (sVar14 == pgVar10->m) {
    sVar16 = sVar14 * 2;
    if (sVar14 == 0) {
      sVar16 = sVar3;
    }
    pgVar10->m = sVar16;
    ppgVar12 = (gnode_t **)realloc(pgVar10->p,sVar16 << 3);
    pgVar10 = parser->statements;
    pgVar10->p = ppgVar12;
    sVar14 = pgVar10->n;
  }
  else {
    ppgVar12 = pgVar10->p;
  }
  pgVar10->n = sVar14 + 1;
  ppgVar12[sVar14] = pgVar11;
  tstart = nanotime();
  do {
    while (gVar5 = gravity_lexer_peek(parser->lexer->p[parser->lexer->n - 1]), gVar5 != TOK_EOF) {
      pgVar11 = parse_statement(parser);
      if (pgVar11 != (gnode_t *)0x0) {
        pgVar10 = parser->statements;
        sVar14 = pgVar10->n;
        if (sVar14 == pgVar10->m) {
          sVar16 = sVar14 * 2;
          if (sVar14 == 0) {
            sVar16 = sVar3;
          }
          pgVar10->m = sVar16;
          ppgVar12 = (gnode_t **)realloc(pgVar10->p,sVar16 << 3);
          pgVar10 = parser->statements;
          pgVar10->p = ppgVar12;
          sVar14 = pgVar10->n;
        }
        else {
          ppgVar12 = pgVar10->p;
        }
        pgVar10->n = sVar14 + 1;
        ppgVar12[sVar14] = pgVar11;
      }
    }
    gravity_lexer_free(parser->lexer->p[parser->lexer->n - 1]);
    plVar13 = parser->lexer;
    plVar13->n = plVar13->n - 1;
  } while (plVar13->n != 0);
  tend = nanotime();
  dVar4 = millitime(tstart,tend);
  parser->time = dVar4;
  if (parser->nerrors == 0) {
    if (parser->declarations->n == 0) {
      pgVar11 = gnode_block_stat_create
                          (NODE_LIST_STAT,(gtoken_s)ZEXT1640(ZEXT816(0)),parser->statements,
                           (gnode_t *)0x0,0);
      return pgVar11;
    }
  }
  else {
    sVar3 = parser->declarations->n;
    if (sVar3 == 0) {
      pgVar11 = (gnode_t *)0x0;
    }
    else {
      pgVar11 = parser->declarations->p[sVar3 - 1];
    }
    pgVar11 = gnode_block_stat_create
                        (NODE_LIST_STAT,(gtoken_s)ZEXT1640(ZEXT816(0)),parser->statements,pgVar11,0)
    ;
    gnode_free(pgVar11);
  }
  return (gnode_t *)0x0;
}

Assistant:

gnode_t *gravity_parser_run (gravity_parser_t *parser, gravity_delegate_t *delegate) {
    parser->delegate = delegate;
    gravity_lexer_setdelegate(CURRENT_LEXER, delegate);

    // check if some user code needs to be prepended
    if ((delegate) && (delegate->precode_callback))
        parser_appendcode(delegate->precode_callback(delegate->xdata), parser);

    // if there are syntax errors then just returns
    if (parser_run(parser) > 0) {
        parser_cleanup (parser);
        return NULL;
    }

    // if there are some open declarations then there should be an error somewhere
    if (marray_size(*parser->declarations) > 0) return NULL;

    // return ast
    return gnode_block_stat_create(NODE_LIST_STAT, NO_TOKEN, parser->statements, NULL, 0);
}